

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_gost2015.c
# Opt level: O0

int gost_mgm128_aad(mgm128_context *ctx,uchar *aad,size_t len)

{
  long lVar1;
  code *pcVar2;
  code *pcVar3;
  ulong uVar4;
  ulong in_RDX;
  byte *in_RSI;
  byte *in_RDI;
  int bl;
  void *key;
  mul128_f mul_gf;
  block128_f block;
  uint64_t alen;
  uint n;
  size_t i;
  uint in_stack_ffffffffffffffa8;
  uint uVar5;
  uint uVar6;
  grasshopper_w128_t *result;
  uint local_2c;
  ulong local_28;
  ulong local_20;
  byte *local_18;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0x50);
  pcVar2 = *(code **)(in_RDI + 0xa8);
  pcVar3 = *(code **)(in_RDI + 0xb0);
  result = *(grasshopper_w128_t **)(in_RDI + 0xc0);
  uVar6 = *(uint *)(in_RDI + 0xb8);
  if (*(long *)(in_RDI + 0x58) == 0) {
    if (lVar1 == 0) {
      *in_RDI = *in_RDI | 0x80;
      (*pcVar2)(in_RDI,in_RDI + 0x20,result);
    }
    uVar4 = in_RDX + lVar1;
    if (((ulong)(1L << ((char)(uVar6 << 2) - 3U & 0x3f)) < uVar4) || (uVar4 < in_RDX)) {
      ERR_GOST_error((int)((ulong)result >> 0x20),(int)result,
                     (char *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),0);
      local_4 = -1;
    }
    else {
      *(ulong *)(in_RDI + 0x50) = uVar4;
      local_2c = *(uint *)(in_RDI + 0xa4);
      uVar5 = in_stack_ffffffffffffffa8;
      local_20 = in_RDX;
      local_18 = in_RSI;
      if (local_2c != 0) {
        while( true ) {
          in_stack_ffffffffffffffa8 = uVar5 & 0xffffff;
          if (local_2c != 0) {
            in_stack_ffffffffffffffa8 = CONCAT13(local_20 != 0,(int3)uVar5);
          }
          if ((char)(in_stack_ffffffffffffffa8 >> 0x18) == '\0') break;
          in_RDI[(ulong)local_2c + 0x60] = *local_18;
          local_20 = local_20 - 1;
          local_2c = (local_2c + 1) % uVar6;
          uVar5 = in_stack_ffffffffffffffa8;
          local_18 = local_18 + 1;
        }
        if (local_2c != 0) {
          *(uint *)(in_RDI + 0xa4) = local_2c;
          return 0;
        }
        (*pcVar2)(in_RDI + 0x20,in_RDI + 0x40,result);
        (*pcVar3)(in_RDI + 0x70,in_RDI + 0x40,in_RDI + 0x60);
        grasshopper_plus128(result,(grasshopper_w128_t *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),
                            (grasshopper_w128_t *)0x1214cd);
        inc_counter(in_RDI + 0x20,(long)((int)uVar6 / 2));
      }
      for (; (ulong)(long)(int)uVar6 <= local_20; local_20 = local_20 - (long)(int)uVar6) {
        (*pcVar2)(in_RDI + 0x20,in_RDI + 0x40,result);
        (*pcVar3)(in_RDI + 0x70,in_RDI + 0x40,local_18);
        grasshopper_plus128(result,(grasshopper_w128_t *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),
                            (grasshopper_w128_t *)0x121581);
        inc_counter(in_RDI + 0x20,(long)((int)uVar6 / 2));
        local_18 = local_18 + (int)uVar6;
      }
      if (local_20 != 0) {
        local_2c = (uint)local_20;
        for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
          in_RDI[local_28 + 0x60] = local_18[local_28];
        }
      }
      *(uint *)(in_RDI + 0xa4) = local_2c;
      local_4 = 0;
    }
  }
  else {
    ERR_GOST_error((int)((ulong)result >> 0x20),(int)result,
                   (char *)CONCAT44(uVar6,in_stack_ffffffffffffffa8),0);
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int gost_mgm128_aad(mgm128_context *ctx, const unsigned char *aad,
                      size_t len)
{
    size_t i;
    unsigned int n;
    uint64_t alen = ctx->len.u[0];
    block128_f block = ctx->block;
    mul128_f mul_gf = ctx->mul_gf;
    void *key = ctx->key;
    int bl = ctx->blocklen;

    if (ctx->len.u[1]) {
        GOSTerr(GOST_F_GOST_MGM128_AAD,
                GOST_R_BAD_ORDER);
        return -2;
    }

    if (alen == 0) {
        ctx->nonce.c[0] |= 0x80;
        (*block) (ctx->nonce.c, ctx->Zi.c, key);    // Z_1 = E_K(1 || nonce)
    }

    alen += len;
    if (alen > ((ossl_uintmax_t)(1) << (bl * 4 - 3)) ||      // < 2^(n/2)  (len stores in bytes)
        (sizeof(len) == 8 && alen < len)) {
            GOSTerr(GOST_F_GOST_MGM128_AAD,
                    GOST_R_DATA_TOO_LARGE);
            return -1;
        }
    ctx->len.u[0] = alen;

    n = ctx->ares;
    if (n) {
        /* Finalize partial_data */
        while (n && len) {
            ctx->ACi.c[n] = *(aad++);
            --len;
            n = (n + 1) % bl;
        }
        if (n == 0) {
            (*block) (ctx->Zi.c, ctx->Hi.c, key);                   // H_i = E_K(Z_i)
            mul_gf(ctx->mul.u, ctx->Hi.u, ctx->ACi.u);              // H_i (x) A_i
            grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,    // acc XOR
              (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
            inc_counter(ctx->Zi.c, bl / 2);                              // Z_{i+1} = incr_l(Z_i)
        } else {
            ctx->ares = n;
            return 0;
        }
    }
    while (len >= bl) {
        (*block) (ctx->Zi.c, ctx->Hi.c, key);                       // H_i = E_K(Z_i)
        mul_gf(ctx->mul.u, ctx->Hi.u, (uint64_t *)aad);             // H_i (x) A_i
        grasshopper_plus128((grasshopper_w128_t*)ctx->sum.u,        // acc XOR
            (grasshopper_w128_t*)ctx->sum.u, (grasshopper_w128_t*)ctx->mul.u);
        inc_counter(ctx->Zi.c, bl / 2);                                  // Z_{i+1} = incr_l(Z_i)
        aad += bl;
        len -= bl;
    }
    if (len) {
        n = (unsigned int)len;
        for (i = 0; i < len; ++i)
            ctx->ACi.c[i] = aad[i];
    }

    ctx->ares = n;
    return 0;
}